

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O0

void __thiscall crnlib::random::seed(random *this,uint32 i1,uint32 i2,uint32 i3)

{
  uint local_20;
  uint i;
  uint32 i3_local;
  uint32 i2_local;
  uint32 i1_local;
  random *this_local;
  
  ranctx::seed(&this->m_ranctx,i1 ^ i2 ^ i3);
  kiss99::seed(&this->m_kiss99,i1,i2,i3);
  well512::seed(&this->m_well512,i1,i2,i3);
  for (local_20 = 0; local_20 < 100; local_20 = local_20 + 1) {
    urand32(this);
  }
  return;
}

Assistant:

void random::seed(uint32 i1, uint32 i2, uint32 i3)
    {
        m_ranctx.seed(i1 ^ i2 ^ i3);

        m_kiss99.seed(i1, i2, i3);

        m_well512.seed(i1, i2, i3);

        for (uint i = 0; i < 100; i++)
        {
            urand32();
        }
    }